

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbojpeg.c
# Opt level: O2

char * tjGetErrorStr2(tjhandle handle)

{
  tjinstance *this;
  long *in_FS_OFFSET;
  
  if ((handle != (tjhandle)0x0) && (*(int *)((long)handle + 0x6d0) != 0)) {
    *(undefined4 *)((long)handle + 0x6d0) = 0;
    return (char *)((long)handle + 0x608);
  }
  return (char *)(*in_FS_OFFSET + -0xd0);
}

Assistant:

DLLEXPORT char *tjGetErrorStr2(tjhandle handle)
{
  tjinstance *this = (tjinstance *)handle;

  if (this && this->isInstanceError) {
    this->isInstanceError = FALSE;
    return this->errStr;
  } else
    return errStr;
}